

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::EpsCopyOutputStream::Skip(EpsCopyOutputStream *this,int count,uint8_t **pp)

{
  uint uVar1;
  uint8_t *puVar2;
  uint8_t *local_38;
  void *data;
  uint8_t **ppuStack_28;
  int size;
  uint8_t **pp_local;
  EpsCopyOutputStream *pEStack_18;
  int count_local;
  EpsCopyOutputStream *this_local;
  
  if (-1 < count) {
    if ((this->had_error_ & 1U) == 0) {
      ppuStack_28 = pp;
      pp_local._4_4_ = count;
      pEStack_18 = this;
      data._4_4_ = Flush(this,*pp);
      if ((this->had_error_ & 1U) == 0) {
        local_38 = this->buffer_end_;
        do {
          if (pp_local._4_4_ <= data._4_4_) {
            puVar2 = SetInitialBuffer(this,local_38 + pp_local._4_4_,data._4_4_ - pp_local._4_4_);
            *ppuStack_28 = puVar2;
            return true;
          }
          pp_local._4_4_ = pp_local._4_4_ - data._4_4_;
          uVar1 = (*this->stream_->_vptr_ZeroCopyOutputStream[2])
                            (this->stream_,&local_38,(long)&data + 4);
        } while ((uVar1 & 1) != 0);
        puVar2 = Error(this);
        *ppuStack_28 = puVar2;
      }
      else {
        *ppuStack_28 = this->buffer_;
      }
    }
    else {
      *pp = this->buffer_;
    }
  }
  return false;
}

Assistant:

bool EpsCopyOutputStream::Skip(int count, uint8_t** pp) {
  if (count < 0) return false;
  if (had_error_) {
    *pp = buffer_;
    return false;
  }
  int size = Flush(*pp);
  if (had_error_) {
    *pp = buffer_;
    return false;
  }
  void* data = buffer_end_;
  while (count > size) {
    count -= size;
    if (!stream_->Next(&data, &size)) {
      *pp = Error();
      return false;
    }
  }
  *pp = SetInitialBuffer(static_cast<uint8_t*>(data) + count, size - count);
  return true;
}